

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile.cc
# Opt level: O1

void __thiscall brown::Tile::Tile(Tile *this,int x,int y,uint32_t fill)

{
  void *pvVar1;
  ulong uVar2;
  uint uVar3;
  
  this->p = x * 4;
  this->x = x;
  this->y = y;
  this->reserved = true;
  uVar3 = y * x;
  uVar2 = 0xffffffffffffffff;
  if (-1 < (int)uVar3) {
    uVar2 = (long)(int)uVar3 * 4;
  }
  pvVar1 = operator_new__(uVar2);
  this->f = (uintptr_t)pvVar1;
  if (0 < (int)uVar3) {
    uVar2 = 0;
    do {
      *(uint32_t *)((long)pvVar1 + uVar2 * 4) = fill;
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
  }
  return;
}

Assistant:

Tile::Tile(int x, int y, std::uint32_t fill):
    Tile(x, y) {
    for (int i = 0; i <  x*y; i++) {
        reinterpret_cast<std::uint32_t*>(f)[i] = fill;
    }
}